

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbabilisticSampler.h
# Opt level: O1

void __thiscall
jaegertracing::samplers::ProbabilisticSampler::ProbabilisticSampler
          (ProbabilisticSampler *this,double samplingRate)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
  *this_00;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  double dVar7;
  initializer_list<jaegertracing::Tag> __l;
  double local_108;
  char *local_100;
  long local_f8;
  char local_f0 [16];
  undefined1 *local_e0;
  long local_d8;
  undefined1 local_d0 [16];
  Tag local_c0;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
  local_58;
  
  (this->super_Sampler)._vptr_Sampler = (_func_int **)&PTR__ProbabilisticSampler_00274b50;
  dVar7 = 1.0;
  if (samplingRate <= 1.0) {
    dVar7 = samplingRate;
  }
  if (dVar7 <= 0.0) {
    dVar7 = 0.0;
  }
  this->_samplingRate = dVar7;
  lVar4 = _DAT_00231930 * (longdouble)dVar7;
  lVar5 = (longdouble)9.223372e+18;
  lVar6 = (longdouble)0;
  if (lVar5 <= lVar4) {
    lVar6 = lVar5;
  }
  uVar1 = (ulong)(lVar5 <= lVar4) << 0x3f ^ (long)ROUND(lVar4 - lVar6);
  uVar2 = 0xffffffffffffffff;
  if (lVar4 != _DAT_00231930) {
    uVar2 = uVar1;
  }
  if (NAN(lVar4) || NAN(_DAT_00231930)) {
    uVar2 = uVar1;
  }
  this->_samplingBoundary = uVar2;
  local_e0 = local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"sampler.type","");
  local_c0._key._M_dataplus._M_p = (pointer)&local_c0._key.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_c0,local_e0,local_e0 + local_d8);
  local_100 = "probabilistic";
  opentracing::v3::util::
  variant<bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>
  ::
  variant<char_const*&,opentracing::v3::util::detail::value_traits<char_const*&,bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>,void>
            (&local_c0._value.super_variant_type,&local_100);
  local_100 = local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"sampler.param","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char*>((string *)local_78,local_100,local_100 + local_f8);
  this_00 = &local_58;
  local_108 = this->_samplingRate;
  opentracing::v3::util::
  variant<bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>
  ::
  variant<double,opentracing::v3::util::detail::value_traits<double,bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>,void>
            (this_00,&local_108);
  __l._M_len = 2;
  __l._M_array = &local_c0;
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector
            (&this->_tags,__l,(allocator_type *)&local_108);
  lVar3 = -0x90;
  do {
    opentracing::v3::util::
    variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
    ::~variant(this_00);
    if ((anon_struct_8_0_00000001_for___align)((long)&this_00[-1].data + 0x10) !=
        this_00[-1].data.__align) {
      operator_delete((void *)this_00[-1].data.__align);
    }
    this_00 = (variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
               *)&this_00[-2].data;
    lVar3 = lVar3 + 0x48;
  } while (lVar3 != 0);
  if (local_100 != local_f0) {
    operator_delete(local_100);
  }
  if (local_e0 != local_d0) {
    operator_delete(local_e0);
  }
  return;
}

Assistant:

explicit ProbabilisticSampler(double samplingRate)
        : _samplingRate(std::max(0.0, std::min(samplingRate, 1.0)))
        , _samplingBoundary(computeSamplingBoundary(_samplingRate))
        , _tags({ { kSamplerTypeTagKey, kSamplerTypeProbabilistic },
                  { kSamplerParamTagKey, _samplingRate } })
    {
    }